

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbkeyboard.cpp
# Opt level: O0

void __thiscall QXcbKeyboard::updateKeymap(QXcbKeyboard *this)

{
  bool bVar1;
  undefined4 uVar2;
  QXcbConnection *pQVar3;
  pointer pxVar4;
  xcb_connection_t *pxVar5;
  pointer pxVar6;
  long in_RDI;
  long in_FS_OFFSET;
  xkb_log_level logLevel;
  KeysymModifierMap keysymMods;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff08;
  QXcbKeyboard *in_stack_ffffffffffffff10;
  pointer in_stack_ffffffffffffff18;
  QMessageLogger *in_stack_ffffffffffffff20;
  KeysymModifierMap *in_stack_ffffffffffffff58;
  QXcbKeyboard *in_stack_ffffffffffffff60;
  char local_88 [32];
  KeysymModifierMap *in_stack_ffffffffffffff98;
  QXcbKeyboard *in_stack_ffffffffffffffa0;
  undefined8 local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QMap<unsigned_int,_int>::QMap((QMap<unsigned_int,_int> *)0x1b1347);
  pQVar3 = QXcbObject::connection((QXcbObject *)(in_RDI + 8));
  bVar1 = QXcbBasicConnection::hasXKB((QXcbBasicConnection *)pQVar3);
  if (!bVar1) {
    keysymsToModifiers(in_stack_ffffffffffffff60);
    QMap<unsigned_int,_int>::operator=
              ((QMap<unsigned_int,_int> *)in_stack_ffffffffffffff10,
               (QMap<unsigned_int,_int> *)in_stack_ffffffffffffff08);
    QMap<unsigned_int,_int>::~QMap((QMap<unsigned_int,_int> *)0x1b1395);
  }
  updateModifiers(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter> *)0x1b13b9);
  if (!bVar1) {
    xkb_context_new(1);
    std::unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter>::reset
              ((unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter> *)in_stack_ffffffffffffff10,
               (pointer)in_stack_ffffffffffffff08);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter> *)0x1b13f4);
    if (!bVar1) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaKeyboard();
      anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1b144f);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08
                   ,(char *)0x1b1468);
        QMessageLogger::warning(&stack0xffffffffffffff98,"failed to create XKB context");
        local_10 = local_10 & 0xffffffffffffff00;
      }
      *(undefined1 *)(in_RDI + 0x10) = 0;
      goto LAB_001b17a7;
    }
    QtPrivateLogging::lcQpaKeyboard();
    bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x1b14ab);
    uVar2 = 10;
    if (bVar1) {
      uVar2 = 0x32;
    }
    pxVar4 = std::unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter>::get
                       ((unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter> *)0x1b14cf);
    xkb_context_set_log_level(pxVar4,uVar2);
  }
  pQVar3 = QXcbObject::connection((QXcbObject *)(in_RDI + 8));
  bVar1 = QXcbBasicConnection::hasXKB((QXcbBasicConnection *)pQVar3);
  if (bVar1) {
    pxVar4 = std::unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter>::get
                       ((unique_ptr<xkb_context,_QXkbCommon::XKBContextDeleter> *)0x1b1514);
    pxVar5 = QXcbObject::xcb_connection((QXcbObject *)0x1b1527);
    xkb_x11_keymap_new_from_device(pxVar4,pxVar5,*(undefined4 *)(in_RDI + 100),0);
    std::unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::reset
              ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)in_stack_ffffffffffffff10,
               (pointer)in_stack_ffffffffffffff08);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b1559);
    if (bVar1) {
      in_stack_ffffffffffffff20 = (QMessageLogger *)(in_RDI + 0x68);
      in_stack_ffffffffffffff18 =
           std::unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::get
                     ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b1579);
      pxVar5 = QXcbObject::xcb_connection((QXcbObject *)0x1b158c);
      xkb_x11_state_new_from_device(in_stack_ffffffffffffff18,pxVar5,*(undefined4 *)(in_RDI + 100));
      std::unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter>::reset
                ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)in_stack_ffffffffffffff10,
                 (pointer)in_stack_ffffffffffffff08);
    }
  }
  else {
    in_stack_ffffffffffffff10 = (QXcbKeyboard *)(in_RDI + 0x70);
    keymapFromCore(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::reset
              ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)in_stack_ffffffffffffff10,
               (pointer)in_stack_ffffffffffffff08);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b15e9);
    if (bVar1) {
      in_stack_ffffffffffffff08 = (QLoggingCategory *)(in_RDI + 0x68);
      pxVar6 = std::unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::get
                         ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b1608);
      xkb_state_new(pxVar6);
      std::unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter>::reset
                ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)in_stack_ffffffffffffff10,
                 (pointer)in_stack_ffffffffffffff08);
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b162c);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<xkb_state,_QXkbCommon::XKBStateDeleter> *)0x1b16de);
    if (bVar1) {
      updateXKBMods(in_stack_ffffffffffffff10);
      pxVar6 = std::unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>::get
                         ((unique_ptr<xkb_keymap,_QXkbCommon::XKBKeymapDeleter> *)0x1b1797);
      QXkbCommon::verifyHasLatinLayout(pxVar6);
    }
    else {
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaKeyboard();
      anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1b1739);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08
                   ,(char *)0x1b174f);
        QMessageLogger::warning(&stack0xffffffffffffff58,"failed to create XKB state");
        local_30 = local_30 & 0xffffffffffffff00;
      }
      *(undefined1 *)(in_RDI + 0x10) = 0;
    }
  }
  else {
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaKeyboard();
    anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_2082ca::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1b1687);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(char *)in_stack_ffffffffffffff08,
                 (char *)0x1b169d);
      QMessageLogger::warning(local_88,"failed to compile a keymap");
      local_20 = local_20 & 0xffffffffffffff00;
    }
    *(undefined1 *)(in_RDI + 0x10) = 0;
  }
LAB_001b17a7:
  QMap<unsigned_int,_int>::~QMap((QMap<unsigned_int,_int> *)0x1b17b4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbKeyboard::updateKeymap()
{
    KeysymModifierMap keysymMods;
    if (!connection()->hasXKB())
        keysymMods = keysymsToModifiers();
    updateModifiers(keysymMods);

    m_config = true;

    if (!m_xkbContext) {
        m_xkbContext.reset(xkb_context_new(XKB_CONTEXT_NO_DEFAULT_INCLUDES));
        if (!m_xkbContext) {
            qCWarning(lcQpaKeyboard, "failed to create XKB context");
            m_config = false;
            return;
        }
        xkb_log_level logLevel = lcQpaKeyboard().isDebugEnabled() ?
                                 XKB_LOG_LEVEL_DEBUG : XKB_LOG_LEVEL_CRITICAL;
        xkb_context_set_log_level(m_xkbContext.get(), logLevel);
    }

    if (connection()->hasXKB()) {
        m_xkbKeymap.reset(xkb_x11_keymap_new_from_device(m_xkbContext.get(), xcb_connection(),
                                                         core_device_id, XKB_KEYMAP_COMPILE_NO_FLAGS));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_x11_state_new_from_device(m_xkbKeymap.get(), xcb_connection(), core_device_id));
    } else {
        m_xkbKeymap.reset(keymapFromCore(keysymMods));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_state_new(m_xkbKeymap.get()));
    }

    if (!m_xkbKeymap) {
        qCWarning(lcQpaKeyboard, "failed to compile a keymap");
        m_config = false;
        return;
    }
    if (!m_xkbState) {
        qCWarning(lcQpaKeyboard, "failed to create XKB state");
        m_config = false;
        return;
    }

    updateXKBMods();

    QXkbCommon::verifyHasLatinLayout(m_xkbKeymap.get());
}